

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws-spa.c
# Opt level: O1

int lws_spa_process(lws_spa *spa,char *in,int len)

{
  char *vbuf;
  char *__s1;
  lws_urldecode_stateful *plVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  size_t len_00;
  byte bVar5;
  uint uVar6;
  char **ppcVar7;
  ulong uVar8;
  ulong uVar9;
  byte *pbVar10;
  
  if (spa == (lws_spa *)0x0) {
    _lws_log(1,"%s: NULL spa\n","lws_spa_process");
LAB_0013ae6c:
    iVar3 = -1;
  }
  else {
    iVar3 = 0;
    if ((spa->finalized == '\0') && (iVar3 = 0, len != 0)) {
      plVar1 = spa->s;
      vbuf = plVar1->name;
      __s1 = plVar1->temp;
      uVar9 = 0;
      do {
        if (plVar1->pos == ~plVar1->mp + plVar1->out_len) {
          iVar3 = (*plVar1->output)(plVar1->data,vbuf,&plVar1->out,plVar1->pos,0);
          if (iVar3 != 0) goto LAB_0013ae6c;
          plVar1->pos = 0;
        }
        pbVar10 = (byte *)in;
        switch(plVar1->state) {
        case US_NAME:
          plVar1->field_0x22c = plVar1->field_0x22c & 0xfd;
          bVar2 = *in;
          iVar3 = plVar1->pos;
          len_00 = (size_t)iVar3;
          if (bVar2 == 0x26) {
            plVar1->name[len_00] = '\0';
            iVar3 = (*plVar1->output)(plVar1->data,vbuf,&plVar1->out,plVar1->pos,1);
            if (iVar3 == 0) {
              plVar1->pos = 0;
              plVar1->state = US_IDLE;
              goto LAB_0013ac76;
            }
            goto LAB_0013ae6c;
          }
          if (bVar2 == 0x3d) {
            plVar1->name[len_00] = '\0';
            plVar1->pos = 0;
            plVar1->state = US_IDLE;
            goto LAB_0013ab99;
          }
          if (0x1e < iVar3) {
            lwsl_hexdump_level(4,vbuf,len_00);
            _lws_log(4,"Name too long...\n");
            goto LAB_0013ae6c;
          }
          pbVar10 = (byte *)in + 1;
          plVar1->pos = iVar3 + 1;
          plVar1->name[len_00] = bVar2;
          break;
        case US_IDLE:
          bVar2 = *in;
          if (bVar2 == 0x2b) {
            pbVar10 = (byte *)in + 1;
            iVar3 = plVar1->pos;
            plVar1->pos = iVar3 + 1;
            plVar1->out[iVar3] = ' ';
          }
          else {
            if (bVar2 == 0x26) {
              plVar1->out[plVar1->pos] = '\0';
              iVar3 = (*plVar1->output)(plVar1->data,vbuf,&plVar1->out,plVar1->pos,1);
              if (iVar3 == 0) {
                plVar1->pos = 0;
                plVar1->state = US_NAME;
                goto LAB_0013ac76;
              }
              goto LAB_0013ae6c;
            }
            if (bVar2 == 0x25) {
              plVar1->state = US_PC1;
              goto LAB_0013ab99;
            }
            pbVar10 = (byte *)in + 1;
            iVar3 = plVar1->pos;
            plVar1->pos = iVar3 + 1;
            plVar1->out[iVar3] = bVar2;
          }
          break;
        case US_PC1:
          bVar2 = char_to_hex(*in);
          if (-1 < (char)bVar2) {
            plVar1->sum = (uint)bVar2 << 4;
            plVar1->state = plVar1->state + US_IDLE;
            goto LAB_0013ac76;
          }
          goto LAB_0013ae6c;
        case US_PC2:
          bVar2 = char_to_hex(*in);
          if ((char)bVar2 < '\0') goto LAB_0013ae6c;
          iVar3 = plVar1->pos;
          plVar1->pos = iVar3 + 1;
          plVar1->out[iVar3] = bVar2 | (byte)plVar1->sum;
          plVar1->state = US_IDLE;
LAB_0013ac76:
          pbVar10 = (byte *)in + 1;
          break;
        case MT_LOOK_BOUND_IN:
          bVar2 = *in;
          iVar3 = plVar1->mp;
          if (bVar2 == plVar1->mime_boundary[iVar3] && plVar1->mime_boundary[iVar3] != 0) {
LAB_0013aade:
            pbVar10 = (byte *)in + 1;
            plVar1->mp = iVar3 + 1;
            if (plVar1->mime_boundary[(long)iVar3 + 1] == '\0') {
              plVar1->mp = 0;
              plVar1->state = MT_IGNORE1;
              iVar3 = (*plVar1->output)(plVar1->data,vbuf,&plVar1->out,plVar1->pos,1);
              if (iVar3 == 0) {
                plVar1->pos = 0;
                plVar1->content_disp[0] = '\0';
                plVar1->name[0] = '\0';
                plVar1->content_disp_filename[0] = '\0';
                plVar1->field_0x22c = plVar1->field_0x22c | 8;
                goto LAB_0013ac76;
              }
              goto LAB_0013ae6c;
            }
          }
          else {
            if (iVar3 != 0) {
              uVar6 = ~(uint)(byte)plVar1->field_0x22c >> 2 & 2;
              if ((int)uVar6 <= iVar3) {
                memcpy(plVar1->out + plVar1->pos,plVar1->mime_boundary + uVar6,
                       (long)(int)(iVar3 - uVar6));
                plVar1->pos = plVar1->pos + plVar1->mp;
                plVar1->mp = 0;
                bVar2 = *in;
                iVar3 = 0;
                if (bVar2 == plVar1->mime_boundary[0] && plVar1->mime_boundary[0] != 0)
                goto LAB_0013aade;
              }
            }
            iVar3 = plVar1->pos;
            plVar1->pos = iVar3 + 1;
            plVar1->out[iVar3] = bVar2;
LAB_0013abad:
            pbVar10 = (byte *)in + 1;
            plVar1->mp = 0;
          }
          break;
        case MT_HNAME:
          bVar2 = *in;
          bVar5 = bVar2 | 0x20;
          if (0x19 < (byte)(bVar2 + 0xbf)) {
            bVar5 = bVar2;
          }
          uVar8 = 0;
          ppcVar7 = mp_hdr;
          iVar3 = 0;
          do {
            if (bVar5 == (*ppcVar7)[plVar1->mp]) {
              uVar9 = uVar8 & 0xffffffff;
            }
            iVar3 = iVar3 + (uint)(bVar5 == (*ppcVar7)[plVar1->mp]);
            uVar8 = uVar8 + 1;
            ppcVar7 = ppcVar7 + 1;
          } while (uVar8 != 3);
          pbVar10 = (byte *)in + 1;
          if (iVar3 == 0) {
            plVar1->state = MT_IGNORE1;
            goto LAB_0013abad;
          }
          lVar4 = (long)plVar1->mp + 1;
          plVar1->mp = (int)lVar4;
          if ((iVar3 == 1) && (iVar3 = (int)uVar9, mp_hdr[iVar3][lVar4] == '\0')) {
            plVar1->mp = 0;
            plVar1->temp[0] = '\0';
            plVar1->field_0x22c = plVar1->field_0x22c & 0xfb;
            if (iVar3 == 2) {
              plVar1->state = MT_LOOK_BOUND_IN;
              uVar9 = 2;
            }
            else {
              plVar1->state = plVar1->state + iVar3 + US_IDLE;
            }
          }
          break;
        case MT_DISP:
          bVar2 = *in;
          if (bVar2 == 0x3b) {
            plVar1->field_0x22c = plVar1->field_0x22c | 4;
            plVar1->temp[0] = '\0';
LAB_0013acd5:
            plVar1->mp = 0;
          }
          else if (bVar2 == 0x22) {
            plVar1->field_0x22c = plVar1->field_0x22c ^ 2;
          }
          else if (bVar2 == 0xd) {
            if ((plVar1->content_disp_filename[0] != '\0') &&
               (iVar3 = (*plVar1->output)(plVar1->data,vbuf,&plVar1->out,plVar1->pos,2), iVar3 != 0)
               ) goto LAB_0013ae6c;
            plVar1->state = MT_IGNORE2;
          }
          else if ((plVar1->field_0x22c & 4) == 0) {
            if (*__s1 == '\0') {
              iVar3 = plVar1->mp;
              if ((long)iVar3 < 0x1f) {
                plVar1->mp = iVar3 + 1;
                plVar1->content_disp[iVar3] = bVar2;
              }
              if ((long)plVar1->mp < 0x20) {
                plVar1->content_disp[plVar1->mp] = '\0';
              }
            }
            else {
              iVar3 = strcmp(__s1,"name");
              if (iVar3 == 0) {
                iVar3 = plVar1->mp;
                if ((long)iVar3 < 0x1f) {
                  plVar1->mp = iVar3 + 1;
                  plVar1->name[iVar3] = bVar2;
                }
                else {
                  plVar1->mp = 0x1f;
                }
                plVar1->name[plVar1->mp] = '\0';
              }
              else {
                iVar3 = strcmp(__s1,"filename");
                if (iVar3 == 0) {
                  iVar3 = plVar1->mp;
                  if ((long)iVar3 < 0xff) {
                    plVar1->mp = iVar3 + 1;
                    plVar1->content_disp_filename[iVar3] = bVar2;
                  }
                  plVar1->content_disp_filename[plVar1->mp] = '\0';
                }
              }
            }
          }
          else {
            iVar3 = plVar1->mp;
            if (bVar2 == 0x3d) {
              plVar1->temp[iVar3] = '\0';
              plVar1->field_0x22c = plVar1->field_0x22c & 0xfb;
              goto LAB_0013acd5;
            }
            if ((iVar3 < 0x1f) && ((plVar1->field_0x22c & 2) != 0 || bVar2 != 0x20)) {
              plVar1->mp = iVar3 + 1;
              plVar1->temp[iVar3] = bVar2;
            }
          }
          pbVar10 = (byte *)in + 1;
          break;
        case MT_TYPE:
          bVar2 = *in;
          if (bVar2 == 0xd) {
            plVar1->state = MT_IGNORE2;
          }
          else {
            iVar3 = plVar1->mp;
            if ((long)iVar3 < 0x1f) {
              plVar1->mp = iVar3 + 1;
              plVar1->content_type[iVar3] = bVar2;
            }
            plVar1->content_type[plVar1->mp] = '\0';
          }
          goto LAB_0013ab99;
        case MT_IGNORE1:
          if (*in == 0xd) {
            plVar1->state = MT_IGNORE2;
          }
          if (*in == 0x2d) {
            plVar1->state = MT_IGNORE3;
          }
          goto LAB_0013ab99;
        case MT_IGNORE2:
          plVar1->mp = 0;
          if (*in == 10) {
            plVar1->state = MT_HNAME;
          }
          goto LAB_0013ab99;
        case MT_IGNORE3:
          if (*in == 0xd) {
            plVar1->state = MT_IGNORE1;
          }
          if (*in == 0x2d) {
            plVar1->state = MT_COMPLETED;
            (plVar1->wsi->http).rx_content_remain = 0;
          }
LAB_0013ab99:
          pbVar10 = (byte *)in + 1;
        }
        len = len + -1;
        in = (char *)pbVar10;
      } while (len != 0);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int
lws_spa_process(struct lws_spa *spa, const char *in, int len)
{
	if (!spa) {
		lwsl_err("%s: NULL spa\n", __func__);
		return -1;
	}
	/* we reject any junk after the last part arrived and we finalized */
	if (spa->finalized)
		return 0;

	return lws_urldecode_s_process(spa->s, in, len);
}